

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_EraseConstIterator_Test::TestBody
          (DenseHashMapMoveTest_EraseConstIterator_Test *this)

{
  const_iterator it_00;
  bool bVar1;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *this_00;
  char *file;
  char *message;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  iterator it;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  h;
  key_type *in_stack_fffffffffffffe68;
  allocator_type *in_stack_fffffffffffffe70;
  AssertionResult *this_01;
  key_equal *in_stack_fffffffffffffe78;
  pointer lhs;
  hasher *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int line;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 uVar2;
  Type type;
  undefined1 in_stack_fffffffffffffeb0 [16];
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint uVar3;
  char *in_stack_fffffffffffffee0;
  AssertionResult *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_f0;
  iterator local_d8;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_c0;
  undefined1 local_a1;
  AssertionResult local_a0;
  iterator local_90;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_5b [91];
  
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (local_5b);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffe90,
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_5b);
  local_70 = 0;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_74 = 0xffffffff;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_deleted_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_78 = 1;
  this_00 = (dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)google::
               dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
               ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                             *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  *(data_type *)
   &(this_00->rep).settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
    enlarge_threshold_ = 1;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::begin((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)in_stack_fffffffffffffe70);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::end((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)in_stack_fffffffffffffe70);
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hashtable_const_iterator(&local_f0,&local_90);
  it_00.end._0_4_ = in_stack_fffffffffffffec0;
  it_00.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              *)in_stack_fffffffffffffeb0._0_8_;
  it_00.pos = (pointer)in_stack_fffffffffffffeb0._8_8_;
  it_00.end._4_4_ = in_stack_fffffffffffffec4;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::erase(this_00,it_00);
  local_a1 = google::
             dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             ::operator==(&local_c0,&local_d8);
  uVar2 = CONCAT13(local_a1,(int3)in_stack_fffffffffffffe9c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f0.pos,(bool *)local_f0.ht,(type *)0x107e4a3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
  type = CONCAT13((char)((uint)uVar2 >> 0x18),CONCAT12(bVar1,(short)uVar2));
  this_01 = (AssertionResult *)local_f0.pos;
  lhs = local_f0.end;
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (char *)in_stack_fffffffffffffed0._M_head_impl);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe8c,(char *)in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0.pos);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    testing::Message::~Message((Message *)0x107e5bf);
    this_01 = (AssertionResult *)local_f0.pos;
    lhs = local_f0.end;
  }
  uVar3 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x107e647);
  if (uVar3 == 0) {
    file = (char *)google::
                   dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   ::size((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                           *)0x107e66a);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (char *)in_stack_fffffffffffffe80,&lhs->first,(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffec8);
    line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x107e6fe);
      testing::internal::AssertHelper::AssertHelper((AssertHelper *)this_00,type,file,line,message);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      testing::Message::~Message((Message *)0x107e74c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x107e7a8);
  }
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x107e7c7);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, EraseConstIterator)
{
    dense_hash_map<int, int> h;
    h.set_empty_key(0);
    h.set_deleted_key(-1);

    h[1] = 1;
    const auto it = h.begin();
    ASSERT_TRUE(h.end() == h.erase(it));
    ASSERT_EQ(0, (int)h.size());
}